

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateVirtualTableUpdate
          (ExpressionContext *ctx,SynBase *source,VariableData *vtable,
          SmallArray<FunctionData_*,_32U> *functionSet,SmallArray<TypeClass_*,_32U> *classTypes)

{
  TypeBase *pTVar1;
  IntrusiveList<ExprBase> expressions_00;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  TypeBase **ppTVar7;
  ExprBase *pEVar8;
  ExprVariableAccess *this;
  ExprVariableDefinition *this_00;
  VariableHandle *this_01;
  FunctionData **ppFVar9;
  char *pcVar10;
  TypeClass **ppTVar11;
  ExprBlock *this_02;
  TypeClass *local_468;
  FunctionData *local_460;
  FunctionData *function_2;
  FunctionData **local_450;
  FunctionData **assignment_1;
  TypeClass *curr;
  TypeClass *local_438;
  TypeClass *type_1;
  TypeBase *pTStack_428;
  uint i_3;
  TypeBase *type;
  FunctionData *function_1;
  undefined1 local_410 [4];
  uint i_2;
  SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> assignments;
  char *pos;
  TypeBase *parentType;
  FunctionData *function;
  undefined1 local_1c8 [4];
  uint i_1;
  SmallArray<FunctionData_*,_32U> functions;
  ExprBase *assignment;
  ExprBase *alloc;
  ExprBase *local_90;
  ExprBase *count;
  TypeFunction *pTStack_80;
  uint i;
  TypeBase *functionType;
  undefined1 local_70 [4];
  uint typeNameHash;
  InplaceStr name;
  IntrusiveList<ExprBase> expressions;
  TraceScope traceScope;
  SmallArray<TypeClass_*,_32U> *classTypes_local;
  SmallArray<FunctionData_*,_32U> *functionSet_local;
  VariableData *vtable_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if ((CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
       ::token == '\0') &&
     (iVar4 = __cxa_guard_acquire(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                                   ::token), iVar4 != 0)) {
    CreateVirtualTableUpdate::token = NULLC::TraceGetToken("analyze","CreateVirtualTableUpdate");
    __cxa_guard_release(&CreateVirtualTableUpdate(ExpressionContext&,SynBase*,VariableData*,SmallArray<FunctionData*,int>&,SmallArray<TypeClass*,int>&)
                         ::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&expressions.tail,CreateVirtualTableUpdate::token);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&name.end);
  InplaceStr::InplaceStr((InplaceStr *)local_70,(vtable->name->name).begin + 0xf);
  uVar6 = strtoul((vtable->name->name).begin + 5,(char **)0x0,10);
  functionType._4_4_ = (uint)uVar6;
  pTStack_80 = (TypeFunction *)0x0;
  count._4_4_ = 0;
  do {
    uVar2 = count._4_4_;
    uVar5 = SmallArray<TypeBase_*,_128U>::size(&ctx->types);
    if (uVar5 <= uVar2) {
LAB_001e5a23:
      if (pTStack_80 == (TypeFunction *)0x0) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,source,"ERROR: Can\'t find function type for virtual function table \'%.*s\'"
                   ,(ulong)(uint)(*(int *)&(vtable->name->name).end -
                                 (int)(vtable->name->name).begin));
      }
      if (vtable->importModule == (ModuleData *)0x0) {
        InplaceStr::InplaceStr((InplaceStr *)&alloc,"__typeCount");
        local_90 = CreateFunctionCall0(ctx,source,_alloc,false,true,true);
        pEVar8 = CreateArrayAllocation(ctx,source,ctx->typeFunctionID,local_90);
        this = ExpressionContext::get<ExprVariableAccess>(ctx);
        ExprVariableAccess::ExprVariableAccess(this,source,vtable->type,vtable);
        functions.allocator = (Allocator *)CreateAssignment(ctx,source,&this->super_ExprBase,pEVar8)
        ;
        this_00 = ExpressionContext::get<ExprVariableDefinition>(ctx);
        pTVar1 = ctx->typeVoid;
        this_01 = ExpressionContext::get<VariableHandle>(ctx);
        VariableHandle::VariableHandle(this_01,(SynBase *)0x0,vtable);
        ExprVariableDefinition::ExprVariableDefinition
                  (this_00,source,pTVar1,this_01,(ExprBase *)functions.allocator);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)&name.end,&this_00->super_ExprBase);
      }
      SmallArray<FunctionData_*,_32U>::SmallArray
                ((SmallArray<FunctionData_*,_32U> *)local_1c8,ctx->allocator);
      for (function._4_4_ = 0; uVar2 = function._4_4_,
          uVar5 = SmallArray<FunctionData_*,_32U>::size(functionSet), uVar2 < uVar5;
          function._4_4_ = function._4_4_ + 1) {
        ppFVar9 = SmallArray<FunctionData_*,_32U>::operator[](functionSet,function._4_4_);
        parentType = (TypeBase *)*ppFVar9;
        pTVar1 = ((FunctionData *)parentType)->scope->ownerType;
        if ((((pTVar1->importModule == (ModuleData *)0x0) ||
             (vtable->importModule == (ModuleData *)0x0)) ||
            (pTVar1->importModule != vtable->importModule)) &&
           (((FunctionData *)parentType)->type == pTStack_80)) {
          pcVar10 = strstr((((FunctionData *)parentType)->name->name).begin,"::");
          InplaceStr::InplaceStr((InplaceStr *)&assignments.allocator,pcVar10 + 2);
          bVar3 = InplaceStr::operator==
                            ((InplaceStr *)&assignments.allocator,(InplaceStr *)local_70);
          if (bVar3) {
            SmallArray<FunctionData_*,_32U>::push_back
                      ((SmallArray<FunctionData_*,_32U> *)local_1c8,(FunctionData **)&parentType);
          }
        }
      }
      SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::SmallDenseMap
                ((SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *)local_410,
                 ctx->allocator);
      for (function_1._4_4_ = 0; uVar2 = function_1._4_4_,
          uVar5 = SmallArray<FunctionData_*,_32U>::size
                            ((SmallArray<FunctionData_*,_32U> *)local_1c8), uVar2 < uVar5;
          function_1._4_4_ = function_1._4_4_ + 1) {
        ppFVar9 = SmallArray<FunctionData_*,_32U>::operator[]
                            ((SmallArray<FunctionData_*,_32U> *)local_1c8,function_1._4_4_);
        type = (TypeBase *)*ppFVar9;
        pTStack_428 = ((FunctionData *)type)->scope->ownerType;
        pEVar8 = CreateVirtualTableAssignment(ctx,source,vtable,pTStack_428,(FunctionData *)type);
        IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&name.end,pEVar8);
        bVar3 = isType<TypeClass>(pTStack_428);
        if (bVar3) {
          SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                    ((SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *)local_410,
                     &stack0xfffffffffffffbd8,(FunctionData **)&type);
        }
      }
      type_1._4_4_ = 0;
      do {
        uVar2 = type_1._4_4_;
        uVar5 = SmallArray<TypeClass_*,_32U>::size(classTypes);
        if (uVar5 <= uVar2) {
          this_02 = ExpressionContext::get<ExprBlock>(ctx);
          expressions_00.tail = expressions.head;
          expressions_00.head = (ExprBase *)name.end;
          ExprBlock::ExprBlock(this_02,source,ctx->typeVoid,expressions_00,(ExprBase *)0x0);
          SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::~SmallDenseMap
                    ((SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *)local_410);
          SmallArray<FunctionData_*,_32U>::~SmallArray((SmallArray<FunctionData_*,_32U> *)local_1c8)
          ;
          NULLC::TraceScope::~TraceScope((TraceScope *)&expressions.tail);
          return &this_02->super_ExprBase;
        }
        ppTVar11 = SmallArray<TypeClass_*,_32U>::operator[](classTypes,type_1._4_4_);
        curr = *ppTVar11;
        local_438 = curr;
        ppFVar9 = SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::find
                            ((SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *)
                             local_410,(TypeBase **)&curr);
        if (ppFVar9 == (FunctionData **)0x0) {
          for (assignment_1 = (FunctionData **)local_438->baseClass;
              assignment_1 != (FunctionData **)0x0;
              assignment_1 = (FunctionData **)assignment_1[0x23]) {
            function_2 = (FunctionData *)assignment_1;
            local_450 = SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::find
                                  ((SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *
                                   )local_410,(TypeBase **)&function_2);
            if (local_450 != (FunctionData **)0x0) {
              local_460 = *local_450;
              pEVar8 = CreateVirtualTableAssignment
                                 (ctx,source,vtable,(TypeBase *)local_438,local_460);
              IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&name.end,pEVar8);
              local_468 = local_438;
              SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U>::insert
                        ((SmallDenseMap<TypeBase_*,_FunctionData_*,_TypeBaseHasher,_32U> *)local_410
                         ,(TypeBase **)&local_468,&local_460);
              break;
            }
          }
        }
        type_1._4_4_ = type_1._4_4_ + 1;
      } while( true );
    }
    ppTVar7 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,count._4_4_);
    if ((*ppTVar7)->nameHash == functionType._4_4_) {
      ppTVar7 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,count._4_4_);
      pTStack_80 = getType<TypeFunction>(*ppTVar7);
      goto LAB_001e5a23;
    }
    count._4_4_ = count._4_4_ + 1;
  } while( true );
}

Assistant:

ExprBase* CreateVirtualTableUpdate(ExpressionContext &ctx, SynBase *source, VariableData *vtable, SmallArray<FunctionData*, 32> &functionSet, SmallArray<TypeClass*, 32> &classTypes)
{
	TRACE_SCOPE("analyze", "CreateVirtualTableUpdate");

	IntrusiveList<ExprBase> expressions;

	// Find function name
	InplaceStr name = InplaceStr(vtable->name->name.begin + 15); // 15 to skip $vtbl0123456789 from name

	// Find function type from name
	unsigned typeNameHash = strtoul(vtable->name->name.begin + 5, NULL, 10);

	TypeBase *functionType = NULL;

	for(unsigned i = 0; i < ctx.types.size(); i++)
	{
		if(ctx.types[i]->nameHash == typeNameHash)
		{
			functionType = getType<TypeFunction>(ctx.types[i]);
			break;
		}
	}

	if(!functionType)
		Stop(ctx, source, "ERROR: Can't find function type for virtual function table '%.*s'", FMT_ISTR(vtable->name->name));

	if(vtable->importModule == NULL)
	{
		ExprBase *count = CreateFunctionCall0(ctx, source, InplaceStr("__typeCount"), false, true, true);

		ExprBase *alloc = CreateArrayAllocation(ctx, source, ctx.typeFunctionID, count);

		ExprBase *assignment = CreateAssignment(ctx, source, new (ctx.get<ExprVariableAccess>()) ExprVariableAccess(source, vtable->type, vtable), alloc);

		expressions.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, vtable), assignment));
	}

	// Find all functions with called name that are member functions and have target type
	SmallArray<FunctionData*, 32> functions(ctx.allocator);

	for(unsigned i = 0; i < functionSet.size(); i++)
	{
		FunctionData *function = functionSet[i];

		TypeBase *parentType = function->scope->ownerType;

		// If both type and table are imported, then it should have been filled up inside the module for that type
		if(parentType->importModule && vtable->importModule && parentType->importModule == vtable->importModule)
			continue;

		if(function->type != functionType)
			continue;

		const char *pos = strstr(function->name->name.begin, "::");

		if(InplaceStr(pos + 2) == name)
			functions.push_back(function);
	}

	SmallDenseMap<TypeBase*, FunctionData*, TypeBaseHasher, 32> assignments(ctx.allocator);

	// Handle direct assignments
	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i];
		TypeBase *type = function->scope->ownerType;

		expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

		// Record that owner type recevied an assignment to this function
		if(isType<TypeClass>(type))
			assignments.insert(type, function);
	}

	// Handle derived classes
	for(unsigned i = 0; i < classTypes.size(); i++)
	{
		TypeClass *type = classTypes[i];

		// Already assigned
		if(assignments.find(type))
			continue;

		// Not assigned directly, walk through base classes
		for(TypeClass *curr = type->baseClass; curr; curr = curr->baseClass)
		{
			if(FunctionData **assignment = assignments.find(curr))
			{
				FunctionData *function = *assignment;

				expressions.push_back(CreateVirtualTableAssignment(ctx, source, vtable, type, function));

				assignments.insert(type, function);
				break;
			}
		}
	}

	return new (ctx.get<ExprBlock>()) ExprBlock(source, ctx.typeVoid, expressions, NULL);
}